

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_event.cpp
# Opt level: O3

void __thiscall sc_core::sc_event::cancel(sc_event *this)

{
  if (this->m_notify_type == TIMED) {
    if (this->m_timed == (sc_event_timed *)0x0) {
      sc_assertion_failed("m_timed != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/kernel/sc_event.cpp"
                          ,0x4e);
    }
    this->m_timed->m_event = (sc_event *)0x0;
    this->m_timed = (sc_event_timed *)0x0;
  }
  else {
    if (this->m_notify_type != DELTA) {
      return;
    }
    sc_simcontext::remove_delta_event(this->m_simc,this);
  }
  this->m_notify_type = NONE;
  return;
}

Assistant:

void
sc_event::cancel()
{
    // cancel a delta or timed notification
    switch( m_notify_type ) {
    case DELTA: {
        // remove this event from the delta events set
        m_simc->remove_delta_event( this );
        m_notify_type = NONE;
        break;
    }
    case TIMED: {
        // remove this event from the timed events set
        sc_assert( m_timed != 0 );
        m_timed->m_event = 0;
        m_timed = 0;
        m_notify_type = NONE;
        break;
    }
    default:
        ;
    }
}